

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makeFunctionType(Builder *this,Id returnType,Vector<Id> *paramTypes)

{
  pointer *pppIVar1;
  pointer puVar2;
  pointer ppIVar3;
  Id *pIVar4;
  iterator __position;
  iterator __position_00;
  Id IVar5;
  Instruction *pIVar6;
  pointer puVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Instruction *local_38;
  
  ppIVar3 = this->groupedTypes[0x21].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (uint)((ulong)((long)this->groupedTypes[0x21].
                               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3) >> 3);
  if (0 < (int)uVar8) {
    puVar7 = (paramTypes->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = (ulong)((long)(paramTypes->
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 2;
    uVar12 = 0;
    iVar10 = (int)uVar11;
    uVar13 = 0;
    if (0 < iVar10) {
      uVar13 = uVar11 & 0xffffffff;
    }
    do {
      local_38 = ppIVar3[uVar12];
      pIVar4 = (local_38->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((*pIVar4 == returnType) &&
         ((int)((ulong)((long)(local_38->operands).
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4) >> 2) + -1
          == iVar10)) {
        uVar11 = 0;
        do {
          if (uVar13 == uVar11) goto LAB_001b224a;
          puVar2 = puVar7 + uVar11;
          lVar9 = uVar11 + 1;
          uVar11 = uVar11 + 1;
        } while (*puVar2 == pIVar4[lVar9]);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uVar8 & 0x7fffffff));
  }
  pIVar6 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar5 = this->uniqueId + 1;
  this->uniqueId = IVar5;
  pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar6->resultId = IVar5;
  pIVar6->typeId = 0;
  pIVar6->opCode = OpTypeFunction;
  (pIVar6->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar6->block = (Block *)0x0;
  local_40._M_head_impl._0_4_ = returnType;
  local_38 = pIVar6;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar6->operands,
             (iterator)0x0,(uint *)&local_40);
  puVar7 = (paramTypes->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(paramTypes->
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 2)) {
    lVar9 = 0;
    do {
      local_40._M_head_impl._0_4_ = puVar7[lVar9];
      __position._M_current =
           (pIVar6->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pIVar6->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar6->operands,__position,(uint *)&local_40);
      }
      else {
        *__position._M_current = puVar7[lVar9];
        (pIVar6->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar9 = lVar9 + 1;
      puVar7 = (paramTypes->
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(paramTypes->
                                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7)
                          >> 2));
  }
  __position_00._M_current =
       this->groupedTypes[0x21].
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      this->groupedTypes[0x21].
      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>
              ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
               (this->groupedTypes + 0x21),__position_00,&local_38);
    local_40._M_head_impl = local_38;
  }
  else {
    *__position_00._M_current = pIVar6;
    pppIVar1 = &this->groupedTypes[0x21].
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
    local_40._M_head_impl = pIVar6;
  }
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,local_38);
LAB_001b224a:
  return local_38->resultId;
}

Assistant:

Id Builder::makeFunctionType(Id returnType, const dxil_spv::Vector<Id>& paramTypes)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeFunction].size(); ++t) {
        type = groupedTypes[OpTypeFunction][t];
        if (type->getIdOperand(0) != returnType || (int)paramTypes.size() != type->getNumOperands() - 1)
            continue;
        bool mismatch = false;
        for (int p = 0; p < (int)paramTypes.size(); ++p) {
            if (paramTypes[p] != type->getIdOperand(p + 1)) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeFunction);
    type->addIdOperand(returnType);
    for (int p = 0; p < (int)paramTypes.size(); ++p)
        type->addIdOperand(paramTypes[p]);
    groupedTypes[OpTypeFunction].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}